

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode
N_VLinearSumVectorArray_Serial
          (int nvec,sunrealtype a,N_Vector *X,sunrealtype b,N_Vector *Y,N_Vector *Z)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  N_Vector in_RCX;
  N_Vector in_RDX;
  N_Vector in_RSI;
  int in_EDI;
  sunrealtype in_XMM0_Qa;
  double in_XMM1_Qa;
  int test;
  N_Vector *V2;
  N_Vector *V1;
  sunrealtype c;
  sunrealtype *zd;
  sunrealtype *yd;
  sunrealtype *xd;
  sunindextype N;
  sunindextype j;
  int i;
  SUNContext_conflict sunctx_local_scope_;
  N_Vector local_c8;
  N_Vector local_b0;
  N_Vector local_98;
  long local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  
  if (in_EDI == 1) {
    N_VLinearSum_Serial(in_XMM1_Qa,in_RDX,(sunrealtype)in_RCX,
                        *(N_Vector *)((long)in_RSI->content + 0x10),
                        (N_Vector)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else if (((in_XMM1_Qa != 1.0) || (NAN(in_XMM1_Qa))) || (in_RCX != in_RDX)) {
    if (((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || (in_RCX != in_RSI)) {
      if (((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) || ((in_XMM1_Qa != 1.0 || (NAN(in_XMM1_Qa)))))
      {
        bVar5 = false;
        if ((in_XMM0_Qa == 1.0) && (!NAN(in_XMM0_Qa))) {
          bVar5 = in_XMM1_Qa == -1.0;
        }
        if ((bVar5) ||
           ((((in_XMM0_Qa == -1.0 && (!NAN(in_XMM0_Qa))) && (in_XMM1_Qa == 1.0)) &&
            (!NAN(in_XMM1_Qa))))) {
          local_98 = in_RDX;
          if (bVar5) {
            local_98 = in_RSI;
            in_RSI = in_RDX;
          }
          VDiffVectorArray_Serial(in_EDI,(N_Vector *)local_98,(N_Vector *)in_RSI,(N_Vector *)in_RCX)
          ;
        }
        else if ((in_XMM0_Qa == 1.0) || ((in_XMM1_Qa == 1.0 && (!NAN(in_XMM1_Qa))))) {
          local_b0 = in_RDX;
          if (in_XMM0_Qa == 1.0) {
            local_b0 = in_RSI;
            in_XMM0_Qa = in_XMM1_Qa;
            in_RSI = in_RDX;
          }
          VLin1VectorArray_Serial
                    (in_EDI,in_XMM0_Qa,(N_Vector *)in_RSI,(N_Vector *)local_b0,(N_Vector *)in_RCX);
        }
        else if ((in_XMM0_Qa == -1.0) || ((in_XMM1_Qa == -1.0 && (!NAN(in_XMM1_Qa))))) {
          local_c8 = in_RDX;
          if (in_XMM0_Qa == -1.0) {
            local_c8 = in_RSI;
            in_XMM0_Qa = in_XMM1_Qa;
            in_RSI = in_RDX;
          }
          VLin2VectorArray_Serial
                    (in_EDI,in_XMM0_Qa,(N_Vector *)in_RSI,(N_Vector *)local_c8,(N_Vector *)in_RCX);
        }
        else if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
          if ((in_XMM0_Qa != -in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(-in_XMM1_Qa))) {
            lVar1 = *((N_Vector)in_RCX->content)->content;
            for (iVar6 = 0; iVar6 < in_EDI; iVar6 = iVar6 + 1) {
              lVar2 = *(long *)(*(&in_RSI->content)[iVar6] + 0x10);
              lVar3 = *(long *)(*(&in_RDX->content)[iVar6] + 0x10);
              lVar4 = *(long *)((long)((N_Vector)(&in_RCX->content)[iVar6])->content + 0x10);
              for (local_48 = 0; local_48 < lVar1; local_48 = local_48 + 1) {
                *(double *)(lVar4 + local_48 * 8) =
                     in_XMM0_Qa * *(double *)(lVar2 + local_48 * 8) +
                     in_XMM1_Qa * *(double *)(lVar3 + local_48 * 8);
              }
            }
          }
          else {
            VScaleDiffVectorArray_Serial
                      (in_EDI,in_XMM0_Qa,(N_Vector *)in_RSI,(N_Vector *)in_RDX,(N_Vector *)in_RCX);
          }
        }
        else {
          VScaleSumVectorArray_Serial
                    (in_EDI,in_XMM0_Qa,(N_Vector *)in_RSI,(N_Vector *)in_RDX,(N_Vector *)in_RCX);
        }
      }
      else {
        VSumVectorArray_Serial(in_EDI,(N_Vector *)in_RSI,(N_Vector *)in_RDX,(N_Vector *)in_RCX);
      }
    }
    else {
      VaxpyVectorArray_Serial(in_EDI,in_XMM1_Qa,(N_Vector *)in_RDX,(N_Vector *)in_RSI);
    }
  }
  else {
    VaxpyVectorArray_Serial(in_EDI,in_XMM0_Qa,(N_Vector *)in_RSI,(N_Vector *)in_RDX);
  }
  return 0;
}

Assistant:

SUNErrCode N_VLinearSumVectorArray_Serial(int nvec, sunrealtype a, N_Vector* X,
                                          sunrealtype b, N_Vector* Y, N_Vector* Z)
{
  SUNFunctionBegin(X[0]->sunctx);

  int i;
  sunindextype j, N;
  sunrealtype* xd = NULL;
  sunrealtype* yd = NULL;
  sunrealtype* zd = NULL;
  sunrealtype c;
  N_Vector* V1;
  N_Vector* V2;
  sunbooleantype test;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VLinearSum */
  if (nvec == 1)
  {
    N_VLinearSum_Serial(a, X[0], b, Y[0], Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* BLAS usage: axpy y <- ax+y */
  if ((b == ONE) && (Z == Y))
  {
    VaxpyVectorArray_Serial(nvec, a, X, Y);
    return SUN_SUCCESS;
  }

  /* BLAS usage: axpy x <- by+x */
  if ((a == ONE) && (Z == X))
  {
    VaxpyVectorArray_Serial(nvec, b, Y, X);
    return SUN_SUCCESS;
  }

  /* Case: a == b == 1.0 */
  if ((a == ONE) && (b == ONE))
  {
    VSumVectorArray_Serial(nvec, X, Y, Z);
    return SUN_SUCCESS;
  }

  /* Cases:                    */
  /*   (1) a == 1.0, b = -1.0, */
  /*   (2) a == -1.0, b == 1.0 */
  if ((test = ((a == ONE) && (b == -ONE))) || ((a == -ONE) && (b == ONE)))
  {
    V1 = test ? Y : X;
    V2 = test ? X : Y;
    VDiffVectorArray_Serial(nvec, V2, V1, Z);
    return SUN_SUCCESS;
  }

  /* Cases:                                                  */
  /*   (1) a == 1.0, b == other or 0.0,                      */
  /*   (2) a == other or 0.0, b == 1.0                       */
  /* if a or b is 0.0, then user should have called N_VScale */
  if ((test = (a == ONE)) || (b == ONE))
  {
    c  = test ? b : a;
    V1 = test ? Y : X;
    V2 = test ? X : Y;
    VLin1VectorArray_Serial(nvec, c, V1, V2, Z);
    return SUN_SUCCESS;
  }

  /* Cases:                     */
  /*   (1) a == -1.0, b != 1.0, */
  /*   (2) a != 1.0, b == -1.0  */
  if ((test = (a == -ONE)) || (b == -ONE))
  {
    c  = test ? b : a;
    V1 = test ? Y : X;
    V2 = test ? X : Y;
    VLin2VectorArray_Serial(nvec, c, V1, V2, Z);
    return SUN_SUCCESS;
  }

  /* Case: a == b                                                         */
  /* catches case both a and b are 0.0 - user should have called N_VConst */
  if (a == b)
  {
    VScaleSumVectorArray_Serial(nvec, a, X, Y, Z);
    return SUN_SUCCESS;
  }

  /* Case: a == -b */
  if (a == -b)
  {
    VScaleDiffVectorArray_Serial(nvec, a, X, Y, Z);
    return SUN_SUCCESS;
  }

  /* Do all cases not handled above:                               */
  /*   (1) a == other, b == 0.0 - user should have called N_VScale */
  /*   (2) a == 0.0, b == other - user should have called N_VScale */
  /*   (3) a,b == other, a !=b, a != -b                            */

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* compute linear sum for each vector pair in vector arrays */
  for (i = 0; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = a * xd[j] + b * yd[j]; }
  }

  return SUN_SUCCESS;
}